

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::commandBindDescriptorsForLayer
          (ImageStoreTestInstance *this,VkCommandBuffer cmdBuffer,VkPipelineLayout pipelineLayout,
          int layerNdx)

{
  DeviceInterface *vk_00;
  VkDevice device_00;
  reference this_00;
  RefBase<vk::Handle<(vk::HandleType)22>_> *this_01;
  Handle<(vk::HandleType)22> *pHVar1;
  reference this_02;
  RefBase<vk::Handle<(vk::HandleType)13>_> *this_03;
  Handle<(vk::HandleType)13> *pHVar2;
  Buffer *this_04;
  VkBuffer *pVVar3;
  DescriptorSetUpdateBuilder *pDVar4;
  Location local_108;
  VkDescriptorSet local_100;
  Location local_e8;
  VkDescriptorSet local_e0;
  DescriptorSetUpdateBuilder local_d8;
  deUint64 local_90;
  undefined1 local_88 [8];
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  VkSampler local_68;
  undefined1 local_60 [8];
  VkDescriptorImageInfo descriptorImageInfo;
  VkImageView imageView;
  VkDescriptorSet descriptorSet;
  VkDevice device;
  DeviceInterface *vk;
  int layerNdx_local;
  VkCommandBuffer cmdBuffer_local;
  ImageStoreTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                     m_context);
  device_00 = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                                 super_TestInstance.m_context);
  this_00 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            ::operator[](&this->m_allDescriptorSets,(long)layerNdx);
  this_01 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                       (this_00)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(this_01);
  imageView.m_internal = pHVar1->m_internal;
  this_02 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            ::operator[](&this->m_allImageViews,(long)layerNdx);
  this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                       (this_02)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(this_03);
  descriptorImageInfo._16_8_ = pHVar2->m_internal;
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_68,0);
  descriptorConstantsBufferInfo.range = descriptorImageInfo._16_8_;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_60,local_68,(VkImageView)descriptorImageInfo._16_8_,
             VK_IMAGE_LAYOUT_GENERAL);
  this_04 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_constantsBuffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar3 = image::Buffer::get(this_04);
  local_90 = pVVar3->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_88,(VkBuffer)local_90,
             (long)layerNdx * this->m_constantsBufferChunkSizeBytes,
             this->m_constantsBufferChunkSizeBytes);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_d8);
  local_e0.m_internal = imageView.m_internal;
  local_e8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar4 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_d8,local_e0,&local_e8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      (VkDescriptorImageInfo *)local_60);
  local_100.m_internal = imageView.m_internal;
  local_108 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar4 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar4,local_100,&local_108,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                      (VkDescriptorBufferInfo *)local_88);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar4,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_d8);
  (*vk_00->_vptr_DeviceInterface[0x56])
            (vk_00,cmdBuffer,1,pipelineLayout.m_internal,0,1,&imageView,0,0);
  return;
}

Assistant:

void ImageStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const VkDescriptorSet descriptorSet = **m_allDescriptorSets[layerNdx];
	const VkImageView imageView = **m_allImageViews[layerNdx];

	const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo(DE_NULL, imageView, VK_IMAGE_LAYOUT_GENERAL);

	// Set the next chunk of the constants buffer. Each chunk begins with layer index that we've set before.
	const VkDescriptorBufferInfo descriptorConstantsBufferInfo = makeDescriptorBufferInfo(
		m_constantsBuffer->get(), layerNdx*m_constantsBufferChunkSizeBytes, m_constantsBufferChunkSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
}